

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  Student s;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  TUPLE tpl;
  int local_e0;
  float local_dc;
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Gpa local_98;
  Age local_94;
  undefined4 local_90;
  long *local_88 [2];
  long local_78 [2];
  _Tuple_impl<0ul,Name,Surname,Gpa,Age> local_68 [8];
  long *local_60;
  long local_50 [2];
  long *local_40;
  long local_30 [2];
  
  local_90 = 10;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"ten","");
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Ali","");
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Kanik","");
  local_98.value = 4.0;
  local_94.value = 0x16;
  operator<<((ostream *)&std::cout,(Student *)local_d8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_d8._0_8_,local_d8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_dc = 4.0;
  local_e0 = 0x16;
  std::_Tuple_impl<0ul,Name,Surname,Gpa,Age>::
  _Tuple_impl<char_const(&)[4],char_const(&)[6],float,int,void>
            (local_68,(char (*) [4])"Ali",(char (*) [6])"Kanik",&local_dc,&local_e0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto p = Pair<int, std::string>{10, "ten"};

    auto s = Student{"Ali", "Kanik", 4.0f, 22};
    std::cout << s << std::endl;
    std::cout << s.name << std::endl;

    using TUPLE = std::tuple<Name, Surname, Gpa, Age>;
    auto tpl = TUPLE("Ali", "Kanik", 4.0f, 22);
//    auto tpl = std::make_tuple("Ali", 4.0f, 22, 3.5f);

//    std::cout << "!" << is_tuple<Student>::value << std::endl;

    // get the number of dimensions of a TUPLE type at compile-time
    std::cout << std::tuple_size_v<TUPLE> << std::endl;

//    TypeDebug< std::tuple_element_t<3, TUPLE> > a;

//    std::cout << std::get<Surname>(tpl) << std::endl;
//    std::cout << std::get<2>(tpl) << std::endl;

    return 0;
}